

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O3

void Ivy_ManStartFanout(Ivy_Man_t *p)

{
  Ivy_Obj_t *pFanout;
  Vec_Ptr_t *pVVar1;
  Ivy_Obj_t *pIVar2;
  long lVar3;
  
  if (p->fFanout == 0) {
    p->fFanout = 1;
    pVVar1 = p->vObjs;
    if (0 < pVVar1->nSize) {
      lVar3 = 0;
      do {
        pFanout = (Ivy_Obj_t *)pVVar1->pArray[lVar3];
        if (pFanout != (Ivy_Obj_t *)0x0) {
          pIVar2 = (Ivy_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe);
          if (pIVar2 != (Ivy_Obj_t *)0x0) {
            Ivy_ObjAddFanout(p,pIVar2,pFanout);
          }
          pIVar2 = (Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe);
          if (pIVar2 != (Ivy_Obj_t *)0x0) {
            Ivy_ObjAddFanout(p,pIVar2,pFanout);
          }
        }
        lVar3 = lVar3 + 1;
        pVVar1 = p->vObjs;
      } while (lVar3 < pVVar1->nSize);
    }
    return;
  }
  __assert_fail("!p->fFanout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFanout.c"
                ,0x8c,"void Ivy_ManStartFanout(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManStartFanout( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( !p->fFanout );
    p->fFanout = 1;
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( Ivy_ObjFanin0(pObj) )
            Ivy_ObjAddFanout( p, Ivy_ObjFanin0(pObj), pObj );
        if ( Ivy_ObjFanin1(pObj) )
            Ivy_ObjAddFanout( p, Ivy_ObjFanin1(pObj), pObj );
    }
}